

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsReceiveQueue.cpp
# Opt level: O1

void __thiscall Scs::ReceiveQueue::Push(ReceiveQueue *this,void *data,size_t bytes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  long lVar3;
  vector<unsigned_char,Scs::Allocator<unsigned_char>> *pvVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  void *pvVar9;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  if (bytes != 0) {
    pvVar9 = data;
    do {
      p_Var5 = p_Stack_40;
      peVar2 = local_48;
      if (this->m_messageSize == 0) {
        if (bytes < 8) {
          __assert_fail("bytes >= sizeof(MessageHeader)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsReceiveQueue.cpp"
                        ,0x31,"void Scs::ReceiveQueue::Push(const void *, size_t)");
        }
        uVar8 = *data;
        if ((uVar8 & 0xffffffff) == 0x6d736373) {
          this->m_messageSize = uVar8 >> 0x20;
          if ((this->m_receiveBuffer).
              super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr == (element_type *)0x0) {
            CreateBuffer();
            local_48 = (element_type *)0x0;
            p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     (this->m_receiveBuffer).
                     super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (this->m_receiveBuffer).
            super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar2;
            (this->m_receiveBuffer).
            super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var5;
            if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
            }
          }
          peVar2 = (this->m_receiveBuffer).
                   super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          lVar3 = *(long *)&(peVar2->
                            super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                            _M_impl;
          if (*(long *)&(peVar2->super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                        _M_impl.field_0x8 != lVar3) {
            *(long *)&(peVar2->super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                      _M_impl.field_0x8 = lVar3;
          }
          bytes = bytes - 8;
          pvVar9 = (void *)((long)pvVar9 + 8);
        }
        else {
          LogWriteLine("Transmission error.  Magic header mismatch.");
        }
        if ((int)uVar8 != 0x6d736373) break;
      }
      pvVar4 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
               (this->m_receiveBuffer).
               super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar8 = (*(long *)pvVar4 - *(long *)(pvVar4 + 8)) + this->m_messageSize;
      if (bytes < uVar8) {
        uVar8 = bytes;
      }
      std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::
      _M_range_insert<unsigned_char_const*>
                (pvVar4,*(long *)(pvVar4 + 8),pvVar9,(void *)((long)pvVar9 + uVar8));
      peVar2 = (this->m_receiveBuffer).
               super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      uVar7 = *(long *)&(peVar2->super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                        _M_impl.field_0x8 -
              *(long *)&(peVar2->super__Vector_base<unsigned_char,_Scs::Allocator<unsigned_char>_>).
                        _M_impl;
      if (this->m_messageSize <= uVar7) {
        if (this->m_messageSize < uVar7) {
          LogWriteLine("Transmission error.  Message exceeds expected size.");
          break;
        }
        std::
        deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
        ::push_back((deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
                     *)this,&this->m_receiveBuffer);
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (this->m_receiveBuffer).
                 super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (this->m_receiveBuffer).
        super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        (this->m_receiveBuffer).
        super___shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
        this->m_messageSize = 0;
      }
      bytes = bytes - uVar8;
      pvVar9 = (void *)((long)pvVar9 + uVar8);
    } while (bytes != 0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void ReceiveQueue::Push(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_mutex);
	const uint8_t * dataBytes = static_cast<const uint8_t *>(data);
	while (bytes)
	{
		// Check to see if this is a new message, and if so, prepare the buffer and write out the header structure
		if (m_messageSize == 0)
		{
			assert(bytes >= sizeof(MessageHeader));
			MessageHeader header;
			memcpy(&header, data, sizeof(MessageHeader));
			if (header.magic != MAGIC_HEADER_VAL)
			{
				LogWriteLine("Transmission error.  Magic header mismatch.");
				return;
			}
			m_messageSize = header.size;
			if (!m_receiveBuffer)
				m_receiveBuffer = CreateBuffer();
			m_receiveBuffer->clear();
			bytes -= sizeof(MessageHeader);
			dataBytes += sizeof(MessageHeader);
		}

		// Don't write out more than the message size yet
		auto bytesToWrite = bytes;
		auto maxBytes = m_messageSize - m_receiveBuffer->size();
		if (bytesToWrite > maxBytes)
			bytesToWrite = maxBytes;

		// Write data into the receive buffer and update our counts
		m_receiveBuffer->insert(m_receiveBuffer->end(), dataBytes, dataBytes + bytesToWrite);
		assert(bytesToWrite <= bytes);
		bytes -= bytesToWrite;
		dataBytes += bytesToWrite;

		if (m_receiveBuffer->size() >= m_messageSize)
		{
			if (m_receiveBuffer->size() > m_messageSize)
			{
				LogWriteLine("Transmission error.  Message exceeds expected size.");
				break;
			}
			else
			{
				m_queue.push(m_receiveBuffer);
			}
			m_receiveBuffer = nullptr;
			m_messageSize = 0;
		}
	}
}